

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

MovePack * movePack_dup(MovePack *movePack)

{
  MovePack *pMVar1;
  Move **ppMVar2;
  Move *pMVar3;
  ulong *in_RDI;
  MovePack *dupMovePack;
  unsigned_long i;
  Move *move;
  
  pMVar1 = movePack_create();
  ppMVar2 = (Move **)malloc(*in_RDI << 3);
  pMVar1->moves = ppMVar2;
  pMVar1->movesCount = *in_RDI;
  for (move = (Move *)0x0; move < (Move *)*in_RDI; move = (Move *)&move->fromSpotType) {
    pMVar3 = move_dup(move);
    pMVar1->moves[(long)move] = pMVar3;
  }
  return pMVar1;
}

Assistant:

MovePack * movePack_dup(MovePack * movePack)
{
	unsigned long i;
	MovePack * dupMovePack = movePack_create();
	dupMovePack->moves = (Move **)malloc(sizeof(Move *)*movePack->movesCount);
	dupMovePack->movesCount = movePack->movesCount;
	for(i=0;i<movePack->movesCount;i++)
	{
		dupMovePack->moves[i] = move_dup(movePack->moves[i]);
	}

	return dupMovePack;
}